

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_snapshot_clone(snap_handle *shandle_in,snap_handle **shandle_out,fdb_seqnum_t seqnum)

{
  fdb_status fVar1;
  
  if ((seqnum == 0xffffffffffffffff) || (shandle_in->seqnum == seqnum)) {
    atomic_incr_uint16_t(&shandle_in->ref_cnt_kvs,memory_order_seq_cst);
    *shandle_out = shandle_in;
    fVar1 = FDB_RESULT_SUCCESS;
  }
  else {
    fVar1 = FDB_RESULT_INVALID_ARGS;
  }
  return fVar1;
}

Assistant:

fdb_status wal_snapshot_clone(struct snap_handle *shandle_in,
                              struct snap_handle **shandle_out,
                              fdb_seqnum_t seqnum)
{
    if (seqnum == FDB_SNAPSHOT_INMEM ||
        shandle_in->seqnum == seqnum) {
        atomic_incr_uint16_t(&shandle_in->ref_cnt_kvs);
        *shandle_out = shandle_in;
        return FDB_RESULT_SUCCESS;
    }
    return FDB_RESULT_INVALID_ARGS;
}